

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

void luaL_addvalue(luaL_Buffer *B)

{
  lua_State *L;
  char *__src;
  char *__dest;
  size_t l;
  size_t local_30;
  
  L = B->L;
  __src = lua_tolstring(L,-1,&local_30);
  if (B->b != B->initb) {
    lua_rotate(L,-2,1);
  }
  if (local_30 != 0) {
    __dest = luaL_prepbuffsize(B,local_30);
    memcpy(__dest,__src,local_30);
    B->n = B->n + local_30;
  }
  lua_rotate(L,B->b == B->initb | 0xfffffffe,-1);
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_addvalue(luaL_Buffer *B) {
    lua_State *L = B->L;
    size_t l;
    const char *s = lua_tolstring(L, -1, &l);
    if (buffonstack(B))
        lua_insert(L, -2);  /* put value below buffer */
    luaL_addlstring(B, s, l);
    lua_remove(L, (buffonstack(B)) ? -2 : -1);  /* remove value */
}